

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckClass
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  VMValue *pVVar4;
  AActor *pAVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar6;
  bool bVar7;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xff,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar5 = (AActor *)(param->field_0).field_1.a;
      if (pAVar5 != (AActor *)0x0) {
        if ((pAVar5->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
          (pAVar5->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar7) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar7 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c488a;
        }
      }
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          pPVar1 = (PClass *)param[1].field_0.field_1.a;
          if ((pPVar1 != (PClass *)0x0) &&
             (pPVar3 = pPVar1, pPVar1 != AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar3 = pPVar3->ParentClass;
              if (pPVar3 == AActor::RegistrationInfo.MyClass) break;
            } while (pPVar3 != (PClass *)0x0);
            if (pPVar3 == (PClass *)0x0) {
              pcVar6 = "checktype == NULL || checktype->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_003c48e7;
            }
          }
          if (numparam < 3) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[2].field_0.field_3.Type != '\0') {
              pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003c48a9;
            }
          }
          else {
            pVVar4 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003c48a9:
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x102,
                            "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 4) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003c48c8;
            }
          }
          else if (param[3].field_0.field_3.Type != '\0') {
            pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003c48c8:
            __assert_fail(pcVar6,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x103,
                          "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          iVar2 = param[3].field_0.i;
          pAVar5 = COPY_AAPTR(pAVar5,pVVar4[2].field_0.i);
          if ((pPVar1 == (PClass *)0x0) || (pAVar5 == (AActor *)0x0)) {
            if (ret->RegType != '\0') goto LAB_003c4864;
            bVar7 = false;
          }
          else {
            pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
            if (iVar2 == 0) {
              if (pPVar3 == (PClass *)0x0) {
                iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
                (pAVar5->super_DThinker).super_DObject.Class =
                     (PClass *)CONCAT44(extraout_var_01,iVar2);
              }
              if (ret->RegType != '\0') goto LAB_003c4864;
              bVar7 = (pAVar5->super_DThinker).super_DObject.Class == pPVar1;
            }
            else {
              if (pPVar3 == (PClass *)0x0) {
                iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
                (pAVar5->super_DThinker).super_DObject.Class =
                     (PClass *)CONCAT44(extraout_var_00,iVar2);
              }
              pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
              bVar7 = pPVar3 != (PClass *)0x0;
              if (pPVar3 != pPVar1 && bVar7) {
                do {
                  pPVar3 = pPVar3->ParentClass;
                  bVar7 = pPVar3 != (PClass *)0x0;
                  if (pPVar3 == pPVar1) break;
                } while (pPVar3 != (PClass *)0x0);
              }
              if (ret->RegType != '\0') {
LAB_003c4864:
                __assert_fail("RegType == REGT_INT",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                              ,0x13f,"void VMReturn::SetInt(int)");
              }
            }
          }
          *(uint *)ret->Location = (uint)bVar7;
          return 1;
        }
        pcVar6 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003c48e7:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x101,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c488a:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x100,
                "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckClass)
{
	if (numret > 0)
	{
		assert(ret != NULL);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS		(checktype, AActor);
		PARAM_INT_DEF	(pick_pointer);
		PARAM_BOOL_DEF	(match_superclass);

		self = COPY_AAPTR(self, pick_pointer);
		if (self == nullptr || checktype == nullptr)
		{
			ret->SetInt(false);
		}
		else if (match_superclass)
		{
			ret->SetInt(self->IsKindOf(checktype));
		}
		else
		{
			ret->SetInt(self->GetClass() == checktype);
		}
		return 1;
	}
	return 0;
}